

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O0

Vec_Int_t * Gia_RsbCiTranslate(Gia_Man_t *p,Vec_Int_t *vObjs,Vec_Int_t *vMap)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj_00;
  int local_7c;
  int local_74;
  int local_64;
  int local_58;
  Gia_Obj_t *pObj;
  Vec_Int_t *vNodes;
  int Fan1;
  int Fan0;
  int Lit1;
  int Lit0;
  int iObj;
  int i;
  Vec_Int_t *vMap_local;
  Vec_Int_t *vObjs_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  iVar1 = Vec_IntSize(vMap);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(vMap) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x29d,"Vec_Int_t *Gia_RsbCiTranslate(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  Vec_IntPushTwo(p_00,0,0);
  Lit0 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vObjs);
    if (iVar1 <= Lit0) {
      for (Lit0 = 0; iVar1 = Vec_IntSize(vObjs), Lit0 < iVar1; Lit0 = Lit0 + 1) {
        iVar1 = Vec_IntEntry(vObjs,Lit0);
        iVar2 = Gia_WinNodeHasUnmarkedFanouts(p,iVar1);
        if (iVar2 != 0) {
          iVar2 = Vec_IntEntry(vMap,iVar1);
          iVar1 = Vec_IntEntry(vMap,iVar1);
          Vec_IntPushTwo(p_00,iVar2,iVar1);
        }
      }
      return p_00;
    }
    iVar1 = Vec_IntEntry(vObjs,Lit0);
    pObj_00 = Gia_ManObj(p,iVar1);
    iVar2 = Gia_ObjIsTravIdCurrentId(p,iVar1);
    if (iVar2 == 0) break;
    iVar2 = Gia_ObjIsCi(pObj_00);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjFaninId0(pObj_00,iVar1);
      local_58 = Vec_IntEntry(vMap,iVar2);
    }
    else {
      local_58 = 0;
    }
    iVar2 = Gia_ObjIsCi(pObj_00);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjFaninId1(pObj_00,iVar1);
      local_64 = Vec_IntEntry(vMap,iVar2);
    }
    else {
      local_64 = 0;
    }
    iVar2 = Gia_ObjIsCi(pObj_00);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjFaninC0(pObj_00);
      local_74 = Abc_LitNotCond(local_58,iVar2);
    }
    else {
      local_74 = 0;
    }
    iVar2 = Gia_ObjIsCi(pObj_00);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjFaninC1(pObj_00);
      local_7c = Abc_LitNotCond(local_64,iVar2);
    }
    else {
      local_7c = 0;
    }
    iVar2 = Vec_IntSize(p_00);
    Vec_IntWriteEntry(vMap,iVar1,iVar2);
    Vec_IntPushTwo(p_00,local_74,local_7c);
    Lit0 = Lit0 + 1;
  }
  __assert_fail("Gia_ObjIsTravIdCurrentId(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                ,0x2a2,"Vec_Int_t *Gia_RsbCiTranslate(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Gia_RsbCiTranslate( Gia_Man_t * p, Vec_Int_t * vObjs, Vec_Int_t * vMap )
{
    int i, iObj, Lit0, Lit1, Fan0, Fan1;
    Vec_Int_t * vNodes = Vec_IntAlloc( 100 );
    assert( Vec_IntSize(vMap) == Gia_ManObjNum(p) );
    Vec_IntPushTwo( vNodes, 0, 0 ); // const0 node
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj(p, iObj);
        assert( Gia_ObjIsTravIdCurrentId(p, iObj) );
        Fan0 = Gia_ObjIsCi(pObj) ? 0 : Vec_IntEntry(vMap, Gia_ObjFaninId0(pObj, iObj));
        Fan1 = Gia_ObjIsCi(pObj) ? 0 : Vec_IntEntry(vMap, Gia_ObjFaninId1(pObj, iObj));
        Lit0 = Gia_ObjIsCi(pObj) ? 0 : Abc_LitNotCond( Fan0, Gia_ObjFaninC0(pObj) );
        Lit1 = Gia_ObjIsCi(pObj) ? 0 : Abc_LitNotCond( Fan1, Gia_ObjFaninC1(pObj) );
        Vec_IntWriteEntry( vMap, iObj, Vec_IntSize(vNodes) );
        Vec_IntPushTwo( vNodes, Lit0, Lit1 );
    }
    Vec_IntForEachEntry( vObjs, iObj, i )
        if ( Gia_WinNodeHasUnmarkedFanouts( p, iObj ) )
            Vec_IntPushTwo( vNodes, Vec_IntEntry(vMap, iObj), Vec_IntEntry(vMap, iObj) );
    return vNodes;
}